

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

void anon_unknown.dwarf_52dd::indirect(ostream *stream,Indirect *type)

{
  ostream *poVar1;
  string sStack_98;
  string local_78;
  string local_58;
  string local_38;
  
  poVar1 = std::operator<<(stream," name=\"");
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(&local_58,&local_38);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  poVar1 = std::operator<<(poVar1,"\" of=\"");
  Typelib::Indirect::getIndirection();
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(&local_78,&sStack_98);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  std::operator<<(poVar1,"\"");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void indirect(ostream& stream, Indirect const& type)
    {
        stream
            << " name=\"" << xmlEscape(type.getName())
            << "\" of=\"" << xmlEscape(type.getIndirection().getName()) << "\"";
    }